

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  SPIRConstant *pSVar7;
  TypedID *pTVar8;
  CompilerError *this_00;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar9;
  uint *puVar10;
  size_t sVar11;
  char *pcVar12;
  mapped_type *pmVar13;
  mapped_type *this_01;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar14;
  byte local_399;
  bool local_363;
  bool local_361;
  VariableID *local_2b8;
  VariableID *local_2b0;
  bool local_29b;
  bool local_29a;
  bool local_299;
  TypedID<(spirv_cross::Types)0> local_28c;
  TypedID<(spirv_cross::Types)0> local_288;
  TypedID<(spirv_cross::Types)1> local_284;
  SPIRVariable *local_280;
  SPIRVariable *dest_var;
  SPIRConstant *c_1;
  Meta *local_268;
  Meta *m;
  _Node_iterator_base<unsigned_int,_false> _Stack_258;
  uint32_t i_2;
  undefined1 local_250;
  _Node_iterator_base<unsigned_int,_false> local_248;
  undefined1 local_240;
  ID local_238;
  bool local_231;
  SPIRExpression *local_230;
  SPIRExpression *expr;
  SPIRType *pSStack_220;
  uint32_t i_1;
  SPIRType *expr_type;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [71];
  byte local_191;
  SPIRExpression *pSStack_190;
  bool split_access_chain_formulation;
  SPIRExpression *ptr_expr;
  string local_168 [8];
  string e;
  bool local_145;
  uint32_t local_144;
  bool local_13d;
  uint32_t local_13c;
  bool local_135;
  uint local_134;
  uint32_t uStack_130;
  bool defer_access_chain;
  uint32_t j;
  uint32_t mbr_idx_2;
  __node_base local_108;
  SPIRConstant *c;
  SPIRType *pSStack_f8;
  uint32_t mbr_idx_1;
  SPIRType *type_1;
  __node_base _Stack_e8;
  uint32_t i;
  SPIRType *ptr_type;
  float local_d8;
  uint32_t uStack_d4;
  bool further_access_chain_is_trivial;
  uint32_t index;
  uint32_t const_mbr_id;
  SPIRType *result_ptr_type;
  VariableID ptr;
  VariableID stage_var_id;
  uint32_t first_non_array_index;
  undefined1 local_a8 [4];
  uint32_t next_id;
  SmallVector<unsigned_int,_8UL> indices;
  AccessChainMeta meta;
  uint32_t mbr_idx;
  uint32_t relevant_member_index;
  uint32_t uStack_54;
  bool masked;
  BuiltIn bi_type;
  bool variable_is_flat;
  TypedID<(spirv_cross::Types)0> TStack_48;
  bool builtin_variable;
  uint32_t local_44;
  SPIRType *local_40;
  SPIRType *type;
  bool is_arrayed;
  bool is_block;
  bool flatten_composites;
  bool ptr_is_chain;
  bool flat_data;
  SPIRVariable *pSStack_30;
  bool patch;
  SPIRVariable *var;
  uint32_t *puStack_20;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerMSL *this_local;
  
  var._4_4_ = length;
  puStack_20 = ops;
  ops_local = (uint32_t *)this;
  pSStack_30 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  type._7_1_ = 0;
  type._6_1_ = 0;
  type._5_1_ = false;
  type._4_1_ = 0;
  type._3_1_ = 0;
  type._2_1_ = 0;
  if (pSStack_30 != (SPIRVariable *)0x0) {
    local_40 = Compiler::get_variable_data_type((Compiler *)this,pSStack_30);
    local_44 = (local_40->super_IVariant).self.id;
    type._3_1_ = Compiler::has_decoration((Compiler *)this,(ID)local_44,DecorationBlock);
    bVar1 = VectorView<unsigned_int>::empty(&(local_40->array).super_VectorView<unsigned_int>);
    type._2_1_ = (bVar1 ^ 0xffU) & 1;
    type._4_1_ = variable_storage_requires_stage_io(this,pSStack_30->storage);
    TypedID<(spirv_cross::Types)0>::TypedID(&stack0xffffffffffffffb8,puStack_20[2]);
    bVar1 = Compiler::has_decoration((Compiler *)this,(ID)TStack_48.id,DecorationPatch);
    local_299 = true;
    if (!bVar1) {
      local_299 = is_patch_block(this,local_40);
    }
    type._7_1_ = local_299;
    local_29a = true;
    if (pSStack_30->storage != StorageClassInput) {
      local_29b = false;
      if (pSStack_30->storage == StorageClassOutput) {
        local_29b = is_tesc_shader(this);
      }
      local_29a = local_29b;
    }
    type._6_1_ = local_29a;
    if (((type._7_1_ & 1) != 0) &&
       ((((type._3_1_ & 1) == 0 || ((type._2_1_ & 1) != 0)) ||
        (pSStack_30->storage == StorageClassInput)))) {
      type._6_1_ = false;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_30->super_IVariant).self);
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&bi_type,puStack_20[2]);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&bi_type);
    type._5_1_ = uVar3 != uVar4;
  }
  bVar1 = false;
  if ((pSStack_30 != (SPIRVariable *)0x0) && ((type._6_1_ & 1) != 0)) {
    bVar2 = Compiler::is_builtin_variable((Compiler *)this,pSStack_30);
    uStack_54 = 0x7fffffff;
    if ((bVar2) && ((type._3_1_ & 1) == 0)) {
      uStack_54 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pSStack_30->super_IVariant).self.id,
                             DecorationBuiltIn);
    }
    bVar1 = true;
    if (((bVar2) && (bVar1 = true, (type._3_1_ & 1) == 0)) &&
       ((bVar1 = true, uStack_54 != 0 &&
        ((bVar1 = true, uStack_54 != 1 && (bVar1 = true, uStack_54 != 3)))))) {
      bVar1 = uStack_54 == 4;
    }
  }
  if (bVar1) {
    if ((pSStack_30->storage == StorageClassOutput) && ((type._5_1_ & 1) == 0)) {
      mbr_idx._3_1_ = false;
      if ((type._3_1_ & 1) == 0) {
        if (pSStack_30 != (SPIRVariable *)0x0) {
          mbr_idx._3_1_ =
               CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,pSStack_30);
        }
      }
      else {
        uVar5 = 4;
        if ((type._7_1_ & 1) != 0) {
          uVar5 = 3;
        }
        if (uVar5 < var._4_4_) {
          pSVar7 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,puStack_20[uVar5]);
          uVar3 = SPIRConstant::scalar(pSVar7,0,0);
          mbr_idx._3_1_ =
               CompilerGLSL::is_stage_output_block_member_masked
                         (&this->super_CompilerGLSL,pSStack_30,uVar3,true);
        }
      }
      if (mbr_idx._3_1_ != false) {
        this_local._7_1_ = 0;
        goto LAB_004bd2ff;
      }
    }
    AccessChainMeta::AccessChainMeta((AccessChainMeta *)(indices.stack_storage.aligned_char + 0x18))
    ;
    SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_a8);
    uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    SmallVector<unsigned_int,_8UL>::reserve
              ((SmallVector<unsigned_int,_8UL> *)local_a8,(ulong)(var._4_4_ - 2));
    iVar6 = 4;
    if ((type._5_1_ & 1) != 0) {
      iVar6 = 3;
    }
    ptr.id = iVar6 - (uint)((type._7_1_ & 1) != 0);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&result_ptr_type + 4));
    if ((type._7_1_ & 1) == 0) {
      if (pSStack_30->storage == StorageClassInput) {
        local_2b8 = &this->stage_in_ptr_var_id;
      }
      else {
        local_2b8 = &this->stage_out_ptr_var_id;
      }
      result_ptr_type._4_4_ = local_2b8->id;
    }
    else {
      if (pSStack_30->storage == StorageClassInput) {
        local_2b0 = &this->patch_stage_in_var_id;
      }
      else {
        local_2b0 = &this->patch_stage_out_var_id;
      }
      result_ptr_type._4_4_ = local_2b0->id;
    }
    if ((type._5_1_ & 1) == 0) {
      result_ptr_type._0_4_ = result_ptr_type._4_4_;
    }
    else {
      TypedID<(spirv_cross::Types)2>::TypedID
                ((TypedID<(spirv_cross::Types)2> *)&result_ptr_type,puStack_20[2]);
    }
    if (((type._5_1_ & 1) == 0) && ((type._7_1_ & 1) == 0)) {
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)local_a8,puStack_20 + (ptr.id - 1));
    }
    _index = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*puStack_20);
    uStack_d4 = uVar3;
    local_d8 = (float)Compiler::get_extended_decoration
                                ((Compiler *)this,puStack_20[2],
                                 SPIRVCrossDecorationInterfaceMemberIndex);
    ptr_type._7_1_ = 0;
    if (((type._5_1_ & 1) != 0) && ((type._4_1_ & 1) != 0)) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
      _Stack_e8._M_nxt = (_Hash_node_base *)Compiler::expression_type((Compiler *)this,uVar3);
      bVar1 = Compiler::is_array((Compiler *)this,(SPIRType *)_Stack_e8._M_nxt);
      if ((!bVar1) &&
         ((bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_e8._M_nxt), !bVar1 &&
          (*(int *)((ID *)(_Stack_e8._M_nxt + 1) + 1) != 0xf)))) {
        ptr_type._7_1_ = 1;
      }
    }
    uVar3 = uStack_d4;
    if (((ptr_type._7_1_ & 1) == 0) && (((type._4_1_ & 1) != 0 || ((type._3_1_ & 1) != 0)))) {
      type_1._4_4_ = ptr.id;
      pSStack_f8 = Compiler::get_variable_element_type((Compiler *)this,pSStack_30);
      if ((local_d8 == -NAN) && (ptr.id + 1 <= var._4_4_)) {
        TypedID<(spirv_cross::Types)3>::TypedID
                  ((TypedID<(spirv_cross::Types)3> *)&c,puStack_20[ptr.id]);
        pSVar7 = Compiler::get_constant((Compiler *)this,c._0_4_);
        c._4_4_ = SPIRConstant::scalar(pSVar7,0,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_30->super_IVariant).self);
        local_d8 = (float)Compiler::get_extended_member_decoration
                                    ((Compiler *)this,uVar3,c._4_4_,
                                     SPIRVCrossDecorationInterfaceMemberIndex);
        if (local_d8 == -NAN) {
          __assert_fail("index != uint32_t(-1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1f3e,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                       );
        }
        type_1._4_4_ = type_1._4_4_ + 1;
        pTVar8 = (TypedID *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           (&(pSStack_f8->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                            (ulong)c._4_4_);
        uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar8);
        pSStack_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      }
      while (((type._4_1_ & 1) != 0 && type_1._4_4_ < var._4_4_ &&
             (((bVar1 = Compiler::is_array((Compiler *)this,pSStack_f8), bVar1 ||
               (bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_f8), bVar1)) ||
              (*(int *)&(pSStack_f8->super_IVariant).field_0xc == 0xf))))) {
        local_108._M_nxt =
             (_Hash_node_base *)
             Compiler::maybe_get<spirv_cross::SPIRConstant>
                       ((Compiler *)this,puStack_20[type_1._4_4_]);
        if (((SPIRConstant *)local_108._M_nxt == (SPIRConstant *)0x0) ||
           ((((SPIRConstant *)local_108._M_nxt)->specialization & 1U) != 0)) {
          j._2_1_ = 1;
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&mbr_idx_2,
                     "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                     ,(allocator *)((long)&j + 3));
          CompilerError::CompilerError(this_00,(string *)&mbr_idx_2);
          j._2_1_ = 0;
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((*(int *)&(pSStack_f8->super_IVariant).field_0xc == 0xf) &&
           (pSStack_30->storage == StorageClassOutput)) {
          uStack_130 = SPIRConstant::scalar((SPIRConstant *)local_108._M_nxt,0,0);
          for (local_134 = 0; local_134 < uStack_130; local_134 = local_134 + 1) {
            bVar1 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,pSStack_30,local_134,true);
            if (!bVar1) {
              local_d8 = (float)((int)local_d8 + 1);
            }
          }
        }
        else {
          uVar3 = SPIRConstant::scalar((SPIRConstant *)local_108._M_nxt,0,0);
          local_d8 = (float)(uVar3 + (int)local_d8);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_f8->parent_type);
        if (uVar3 == 0) {
          if (*(int *)&(pSStack_f8->super_IVariant).field_0xc == 0xf) {
            pSVar9 = &pSStack_f8->member_types;
            uVar3 = SPIRConstant::scalar((SPIRConstant *)local_108._M_nxt,0,0);
            pTVar8 = (TypedID *)
                     VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                               (&pSVar9->
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                                (ulong)uVar3);
            uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar8);
            pSStack_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          }
        }
        else {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_f8->parent_type);
          pSStack_f8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        }
        type_1._4_4_ = type_1._4_4_ + 1;
      }
      local_361 = false;
      if ((type._4_1_ & 1) != 0) {
        bVar1 = Compiler::is_matrix((Compiler *)this,_index);
        local_363 = true;
        if (!bVar1) {
          bVar1 = Compiler::is_array((Compiler *)this,_index);
          local_363 = true;
          if (!bVar1) {
            local_363 = *(int *)&(_index->super_IVariant).field_0xc == 0xf;
          }
        }
        local_361 = local_363;
      }
      uVar3 = uStack_d4;
      local_135 = local_361;
      if (local_361 == false) {
        local_13c = get_uint_type_id(this);
        local_13d = false;
        Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                  ((Compiler *)this,uVar3,&local_13c,(uint *)&local_d8,&local_13d);
        SmallVector<unsigned_int,_8UL>::push_back
                  ((SmallVector<unsigned_int,_8UL> *)local_a8,&stack0xffffffffffffff2c);
        local_d8 = -NAN;
        if (type_1._4_4_ < var._4_4_) {
          puVar10 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_a8);
          SmallVector<unsigned_int,_8UL>::insert
                    ((SmallVector<unsigned_int,_8UL> *)local_a8,puVar10,puStack_20 + type_1._4_4_,
                     puStack_20 + var._4_4_);
        }
      }
      else if (type_1._4_4_ != var._4_4_) {
        __assert_fail("i == length",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f79,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      if (local_d8 == -NAN) {
        Compiler::unset_extended_decoration
                  ((Compiler *)this,puStack_20[1],SPIRVCrossDecorationInterfaceMemberIndex);
      }
      else {
        Compiler::set_extended_decoration
                  ((Compiler *)this,puStack_20[1],SPIRVCrossDecorationInterfaceMemberIndex,
                   (uint32_t)local_d8);
      }
    }
    else {
      if (local_d8 != -NAN) {
        local_144 = get_uint_type_id(this);
        local_145 = false;
        Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                  ((Compiler *)this,uVar3,&local_144,(uint *)&local_d8,&local_145);
        SmallVector<unsigned_int,_8UL>::push_back
                  ((SmallVector<unsigned_int,_8UL> *)local_a8,&stack0xffffffffffffff2c);
      }
      local_d8 = -NAN;
      Compiler::unset_extended_decoration
                ((Compiler *)this,puStack_20[1],SPIRVCrossDecorationInterfaceMemberIndex);
      puVar10 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_a8);
      SmallVector<unsigned_int,_8UL>::insert
                ((SmallVector<unsigned_int,_8UL> *)local_a8,puVar10,puStack_20 + ptr.id,
                 puStack_20 + var._4_4_);
    }
    ::std::__cxx11::string::string(local_168);
    uVar3 = (uint32_t)this;
    if ((type._5_1_ & 1) == 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
      puVar10 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_a8);
      sVar11 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_a8);
      CompilerGLSL::access_chain_abi_cxx11_
                ((CompilerGLSL *)&ptr_expr,uVar3,(uint32_t *)(ulong)uVar4,(uint32_t)puVar10,
                 (SPIRType *)(sVar11 & 0xffffffff),(AccessChainMeta *)_index,
                 (bool)((char)&indices + '0'));
      ::std::__cxx11::string::operator=(local_168,(string *)&ptr_expr);
      ::std::__cxx11::string::~string((string *)&ptr_expr);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
      pSStack_190 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,uVar4);
      local_399 = 0;
      if (((type._4_1_ & 1) != 0) && (local_399 = 0, pSStack_190 != (SPIRExpression *)0x0)) {
        sVar11 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::size
                           (&(pSStack_190->implied_read_expressions).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
        local_399 = 0;
        if (sVar11 == 2) {
          local_399 = ptr_type._7_1_ ^ 0xff;
        }
      }
      local_191 = local_399 & 1;
      if (local_191 == 0) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
        puVar10 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_a8);
        sVar11 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_a8);
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  ((CompilerGLSL *)&expr_type,uVar3,(uint32_t *)(ulong)uVar4,(uint32_t)puVar10,
                   (AccessChainFlags)sVar11,(AccessChainMeta *)0x0);
        ::std::__cxx11::string::operator=(local_168,(string *)&expr_type);
        ::std::__cxx11::string::~string((string *)&expr_type);
      }
      else {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_1d8,uVar3,SUB41(uVar4,0));
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&result_ptr_type + 4));
        puVar10 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_a8);
        sVar11 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_a8);
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  ((CompilerGLSL *)local_1f8,uVar3,(uint32_t *)(ulong)uVar4,(uint32_t)puVar10,
                   (AccessChainFlags)sVar11,(AccessChainMeta *)0x2);
        join<std::__cxx11::string,std::__cxx11::string>
                  ((spirv_cross *)(local_1d8 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        ::std::__cxx11::string::operator=(local_168,(string *)(local_1d8 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_1d8 + 0x20));
        ::std::__cxx11::string::~string((string *)local_1f8);
        ::std::__cxx11::string::~string((string *)local_1d8);
      }
    }
    pSStack_220 = Compiler::get_variable_data_type((Compiler *)this,pSStack_30);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,puStack_20[2],SPIRVCrossDecorationTessIOOriginalInputTypeID)
    ;
    if (bVar1) {
      uVar3 = Compiler::get_extended_decoration
                        ((Compiler *)this,puStack_20[2],
                         SPIRVCrossDecorationTessIOOriginalInputTypeID);
      pSStack_220 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
    }
    for (expr._4_4_ = 3; expr._4_4_ < var._4_4_; expr._4_4_ = expr._4_4_ + 1) {
      bVar1 = Compiler::is_array((Compiler *)this,pSStack_220);
      if ((bVar1) || (*(int *)&(pSStack_220->super_IVariant).field_0xc != 0xf)) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_220->parent_type);
        pSStack_220 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      }
      else {
        pSVar9 = &pSStack_220->member_types;
        pSVar7 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,puStack_20[expr._4_4_]);
        uVar3 = SPIRConstant::scalar(pSVar7,0,0);
        pTVar8 = (TypedID *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           (&pSVar9->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                            (ulong)uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar8);
        pSStack_220 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      }
    }
    bVar1 = Compiler::is_array((Compiler *)this,pSStack_220);
    if ((((!bVar1) && (bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_220), !bVar1)) &&
        (*(int *)&(pSStack_220->super_IVariant).field_0xc != 0xf)) &&
       (_index->vecsize < pSStack_220->vecsize)) {
      pcVar12 = CompilerGLSL::vector_swizzle(_index->vecsize,0);
      ::std::__cxx11::string::operator+=(local_168,pcVar12);
    }
    puVar10 = puStack_20;
    uVar3 = puStack_20[1];
    local_231 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,puStack_20[2]);
    local_230 = Compiler::
                set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                          ((Compiler *)this,uVar3,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168,puVar10,&local_231);
    (local_230->loaded_from).id = (pSStack_30->super_IVariant).self.id;
    local_230->need_transpose = (bool)(indices.stack_storage.aligned_char[0x1c] & 1);
    local_230->access_chain = true;
    if ((indices.stack_storage.aligned_char[0x1d] & 1U) != 0) {
      Compiler::set_extended_decoration
                ((Compiler *)this,puStack_20[1],SPIRVCrossDecorationPhysicalTypePacked,0);
    }
    if (indices.stack_storage.aligned_char._24_4_ != 0) {
      Compiler::set_extended_decoration
                ((Compiler *)this,puStack_20[1],SPIRVCrossDecorationPhysicalTypeID,
                 indices.stack_storage.aligned_char._24_4_);
    }
    if ((indices.stack_storage.aligned_char[0x1e] & 1U) != 0) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_238,puStack_20[1]);
      Compiler::set_decoration((Compiler *)this,local_238,DecorationInvariant,0);
    }
    uVar3 = puStack_20[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_220->super_IVariant).self);
    Compiler::set_extended_decoration
              ((Compiler *)this,uVar3,SPIRVCrossDecorationTessIOOriginalInputTypeID,uVar4);
    pVar14 = ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries,
                      puStack_20 + 1);
    local_248._M_cur =
         (__node_type *)pVar14.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_240 = pVar14.second;
    pVar14 = ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,
                      puStack_20 + 1);
    _Stack_258._M_cur =
         (__node_type *)pVar14.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_250 = pVar14.second;
    for (m._4_4_ = 2; m._4_4_ < var._4_4_; m._4_4_ = m._4_4_ + 1) {
      Compiler::inherit_expression_dependencies((Compiler *)this,puStack_20[1],puStack_20[m._4_4_]);
      Compiler::add_implied_read_expression((Compiler *)this,local_230,puStack_20[m._4_4_]);
    }
    bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::empty
                      (&(local_230->expression_dependencies).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    if (bVar1) {
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::erase(&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries,puStack_20 + 1);
    }
    this_local._7_1_ = 1;
    ::std::__cxx11::string::~string(local_168);
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_a8);
  }
  else {
    if (pSStack_30 == (SPIRVariable *)0x0) {
      TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&c_1 + 4),0);
    }
    else {
      c_1._4_4_ = (pSStack_30->super_IVariant).self.id;
    }
    local_268 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,c_1._4_4_);
    bVar1 = is_tesc_shader(this);
    if ((((bVar1) && (pSStack_30 != (SPIRVariable *)0x0)) && (local_268 != (Meta *)0x0)) &&
       (((local_268->decoration).builtin_type == BuiltInTessLevelInner &&
        (bVar1 = Compiler::is_tessellating_triangles((Compiler *)this), bVar1)))) {
      dest_var = (SPIRVariable *)
                 Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,puStack_20[3]);
      if (((SPIRConstant *)dest_var == (SPIRConstant *)0x0) ||
         (uVar3 = SPIRConstant::scalar((SPIRConstant *)dest_var,0,0), uVar3 != 1)) {
        local_280 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                              ((Compiler *)this,puStack_20[1],pSStack_30);
        TypedID<(spirv_cross::Types)1>::TypedID(&local_284,*puStack_20);
        *(uint32_t *)&(local_280->super_IVariant).field_0xc = local_284.id;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_288,puStack_20[2]);
        pmVar13 = ::std::
                  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                  ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_288);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_28c,puStack_20[1]);
        this_01 = ::std::
                  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                  ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_28c);
        Meta::operator=(this_01,pmVar13);
        Compiler::inherit_expression_dependencies((Compiler *)this,puStack_20[1],puStack_20[2]);
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_004bd2ff:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool flatten_composites = false;

	bool is_block = false;
	bool is_arrayed = false;

	if (var)
	{
		auto &type = get_variable_data_type(*var);
		is_block = has_decoration(type.self, DecorationBlock);
		is_arrayed = !type.array.empty();

		flatten_composites = variable_storage_requires_stage_io(var->storage);
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(type);

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput || (var->storage == StorageClassOutput && is_tesc_shader());

		// Patch inputs are treated as normal block IO variables, so they don't deal with this path at all.
		if (patch && (!is_block || is_arrayed || var->storage == StorageClassInput))
			flat_data = false;

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		// Also, skip ptr chain for patches.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	bool builtin_variable = false;
	bool variable_is_flat = false;

	if (var && flat_data)
	{
		builtin_variable = is_builtin_variable(*var);

		BuiltIn bi_type = BuiltInMax;
		if (builtin_variable && !is_block)
			bi_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

		variable_is_flat = !builtin_variable || is_block ||
		                   bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
		                   bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance;
	}

	if (variable_is_flat)
	{
		// If output is masked, it is emitted as a "normal" variable, just go through normal code paths.
		// Only check this for the first level of access chain.
		// Dealing with this for partial access chains should be possible, but awkward.
		if (var->storage == StorageClassOutput && !ptr_is_chain)
		{
			bool masked = false;
			if (is_block)
			{
				uint32_t relevant_member_index = patch ? 3 : 4;
				// FIXME: This won't work properly if the application first access chains into gl_out element,
				// then access chains into the member. Super weird, but theoretically possible ...
				if (length > relevant_member_index)
				{
					uint32_t mbr_idx = get<SPIRConstant>(ops[relevant_member_index]).scalar();
					masked = is_stage_output_block_member_masked(*var, mbr_idx, true);
				}
			}
			else if (var)
				masked = is_stage_output_variable_masked(*var);

			if (masked)
				return false;
		}

		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = (ptr_is_chain ? 3 : 4) - (patch ? 1 : 0);

		VariableID stage_var_id;
		if (patch)
			stage_var_id = var->storage == StorageClassInput ? patch_stage_in_var_id : patch_stage_out_var_id;
		else
			stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;

		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain && !patch)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[first_non_array_index - 1]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);

		// If we have a pointer chain expression, and we are no longer pointing to a composite
		// object, we are in the clear. There is no longer a need to flatten anything.
		bool further_access_chain_is_trivial = false;
		if (ptr_is_chain && flatten_composites)
		{
			auto &ptr_type = expression_type(ptr);
			if (!is_array(ptr_type) && !is_matrix(ptr_type) && ptr_type.basetype != SPIRType::Struct)
				further_access_chain_is_trivial = true;
		}

		if (!further_access_chain_is_trivial && (flatten_composites || is_block))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				uint32_t mbr_idx = get_constant(ops[first_non_array_index]).scalar();
				index = get_extended_member_decoration(var->self, mbr_idx,
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[mbr_idx]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; flatten_composites && i < length; ++i)
			{
				if (!is_array(*type) && !is_matrix(*type) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				if (type->basetype == SPIRType::Struct && var->storage == StorageClassOutput)
				{
					// Need to consider holes, since individual block members might be masked away.
					uint32_t mbr_idx = c->scalar();
					for (uint32_t j = 0; j < mbr_idx; j++)
						if (!is_stage_output_block_member_masked(*var, j, true))
							index++;
				}
				else
					index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			// We're not going to emit the actual member name, we let any further OpLoad take care of that.
			// Tag the access chain with the member index we're referencing.
			bool defer_access_chain = flatten_composites && (is_matrix(result_ptr_type) || is_array(result_ptr_type) ||
			                                                 result_ptr_type.basetype == SPIRType::Struct);

			if (!defer_access_chain)
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Member index is now irrelevant.
				index = uint32_t(-1);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
			else
			{
				// We must have consumed the entire access chain if we're deferring it.
				assert(i == length);
			}

			if (index != uint32_t(-1))
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			else
				unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);
		}
		else
		{
			if (index != uint32_t(-1))
			{
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);
			}

			// Member index is now irrelevant.
			index = uint32_t(-1);
			unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);

			indices.insert(indices.end(), ops + first_non_array_index, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, !patch);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			bool split_access_chain_formulation = flatten_composites && ptr_expr &&
			                                      ptr_expr->implied_read_expressions.size() == 2 &&
			                                      !further_access_chain_is_trivial;

			if (split_access_chain_formulation)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], std::move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (is_tesc_shader() && var && m && m->decoration.builtin_type == BuiltInTessLevelInner &&
	    is_tessellating_triangles())
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}